

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

span<const_lf::mesh::Entity_*const,_18446744073709551615UL> __thiscall
lf::mesh::hybrid2d::Mesh::Entities(Mesh *this,uint codim)

{
  const_reference __range;
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  stringstream local_430 [8];
  stringstream ss_1;
  ostream local_420 [632];
  stringstream ss;
  uint codim_local;
  Mesh *this_local;
  
  if (codim <= this->dim_world_) {
    __range = std::
              array<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>,_3UL>
              ::operator[](&this->entity_pointers_,(ulong)codim);
    std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::
    span<const_std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_&>
              ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&this_local,__range);
    return _this_local;
  }
  std::__cxx11::stringstream::stringstream(local_430);
  std::operator<<(local_420,"codim > dimWorld.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"codim <= dim_world_",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
             ,&local_479);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_450,&local_478,0x16,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"false",&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
             ,&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"",&local_511);
  lf::base::AssertionFailed(&local_4c0,&local_4e8,0x16,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator(&local_511);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  abort();
}

Assistant:

std::span<const Entity *const> Mesh::Entities(unsigned codim) const {
  LF_ASSERT_MSG(codim >= 0, "codim negative.");
  LF_ASSERT_MSG(codim <= dim_world_, "codim > dimWorld.");

  return entity_pointers_[codim];

  // auto l = [&](auto i) -> const mesh::Entity & { return **i; };
  // switch (codim) {
  //   case 0: {
  //     return {base::make_DereferenceLambdaRandomAccessIterator(
  //                 entity_pointers_[0].begin(), l),
  //             base::make_DereferenceLambdaRandomAccessIterator(
  //                 entity_pointers_[0].end(), l)};
  //   }
  //   case 1:
  //     //return {segments_.begin(), segments_.end()};
  //   case 2:
  //     return {points_.begin(), points_.end()};
  //   default: {
  //     LF_VERIFY_MSG(false, "Something is horribly wrong, codim = " +
  //                              std::to_string(codim) + " is out of bounds.");
  //     return {
  //         base::ForwardIterator<const Entity>(static_cast<Entity
  //         *>(nullptr)), base::ForwardIterator<const
  //         Entity>(static_cast<Entity *>(nullptr))};
  //   }
  // }
}